

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

LINK_ENDPOINT_INSTANCE *
find_link_endpoint_by_input_handle(SESSION_INSTANCE *session,handle input_handle)

{
  LINK_ENDPOINT_INSTANCE *local_20;
  LINK_ENDPOINT_INSTANCE *result;
  uint32_t i;
  handle input_handle_local;
  SESSION_INSTANCE *session_local;
  
  result._0_4_ = 0;
  while (((uint)result < session->link_endpoint_count &&
         (session->link_endpoints[(uint)result]->input_handle != input_handle))) {
    result._0_4_ = (uint)result + 1;
  }
  if ((uint)result == session->link_endpoint_count) {
    local_20 = (LINK_ENDPOINT_INSTANCE *)0x0;
  }
  else {
    local_20 = session->link_endpoints[(uint)result];
  }
  return local_20;
}

Assistant:

static LINK_ENDPOINT_INSTANCE* find_link_endpoint_by_input_handle(SESSION_INSTANCE* session, handle input_handle)
{
    uint32_t i;
    LINK_ENDPOINT_INSTANCE* result;

    for (i = 0; i < session->link_endpoint_count; i++)
    {
        if (session->link_endpoints[i]->input_handle == input_handle)
        {
            break;
        }
    }

    if (i == session->link_endpoint_count)
    {
        result = NULL;
    }
    else
    {
        result = session->link_endpoints[i];
    }

    return result;
}